

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::OstreamOutputStream::OstreamOutputStream
          (OstreamOutputStream *this,ostream *output,int block_size)

{
  undefined4 in_EDX;
  CopyingOutputStreamAdaptor *in_RSI;
  ostream *in_RDI;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  ZeroCopyOutputStream::ZeroCopyOutputStream((ZeroCopyOutputStream *)in_RDI);
  *(undefined ***)in_RDI = &PTR__OstreamOutputStream_006f09b8;
  CopyingOstreamOutputStream::CopyingOstreamOutputStream
            ((CopyingOstreamOutputStream *)(in_RDI + 8),in_RDI);
  CopyingOutputStreamAdaptor::CopyingOutputStreamAdaptor
            (in_RSI,(CopyingOutputStream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             in_stack_ffffffffffffffe4);
  return;
}

Assistant:

OstreamOutputStream::OstreamOutputStream(std::ostream* output, int block_size)
    : copying_output_(output), impl_(&copying_output_, block_size) {}